

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.cpp
# Opt level: O2

set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
* __thiscall
dg::llvmdg::legacy::Function::condNodes
          (set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
           *__return_storage_ptr__,Function *this)

{
  set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
  *psVar1;
  _Base_ptr p_Var2;
  insert_iterator<std::set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>_>
  local_30;
  
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_30.iter._M_node = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       local_30.iter._M_node;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       local_30.iter._M_node;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_30.container = __return_storage_ptr__;
  for (p_Var2 = (this->blocks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->blocks)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    psVar1 = Block::successors(*(Block **)(p_Var2 + 1));
    if (1 < (psVar1->_M_t)._M_impl.super__Rb_tree_header._M_node_count) {
      std::
      insert_iterator<std::set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>_>
      ::operator=(&local_30,(value_type *)(p_Var2 + 1));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<Block *> Function::condNodes() const {
    std::set<Block *> condNodes_;

    std::copy_if(
            blocks.begin(), blocks.end(),
            std::inserter(condNodes_, condNodes_.end()),
            [](const Block *block) { return block->successors().size() > 1; });

    return condNodes_;
}